

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_atomic_cmpxchg_i32_ppc
               (TCGContext_conflict9 *tcg_ctx,TCGv_i32 retv,TCGv_i32 addr,TCGv_i32 cmpv,
               TCGv_i32 newv,TCGArg idx,MemOp_conflict memop)

{
  code *pcVar1;
  MemOp_conflict opc;
  TCGMemOpIdx val;
  TCGv_i32 pTVar2;
  TCGv_i32 ret;
  TCGv_i32 oi;
  gen_atomic_cx_i32_conflict9 gen;
  TCGv_i32 t2;
  TCGv_i32 t1;
  TCGArg idx_local;
  TCGv_i32 newv_local;
  TCGv_i32 cmpv_local;
  TCGv_i32 addr_local;
  TCGv_i32 retv_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  opc = tcg_canonicalize_memop(memop,false,false);
  if ((tcg_ctx->tb_cflags & 0x80000) == 0) {
    pTVar2 = tcg_temp_new_i32(tcg_ctx);
    ret = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_ext_i32(tcg_ctx,ret,cmpv,opc & MO_64);
    tcg_gen_qemu_ld_i32_ppc(tcg_ctx,pTVar2,addr,idx,opc & ~MO_ASHIFT);
    tcg_gen_movcond_i32_ppc(tcg_ctx,TCG_COND_EQ,ret,pTVar2,ret,newv,pTVar2);
    tcg_gen_qemu_st_i32_ppc(tcg_ctx,ret,addr,idx,opc);
    tcg_temp_free_i32(tcg_ctx,ret);
    if ((opc & MO_ASHIFT) == MO_8) {
      tcg_gen_mov_i32(tcg_ctx,retv,pTVar2);
    }
    else {
      tcg_gen_ext_i32(tcg_ctx,retv,pTVar2,opc);
    }
    tcg_temp_free_i32(tcg_ctx,pTVar2);
  }
  else {
    pcVar1 = (code *)table_cmpxchg[opc & MO_BEQ];
    val = make_memop_idx(opc & ~MO_ASHIFT,(uint)idx);
    pTVar2 = tcg_const_i32_ppc(tcg_ctx,val);
    (*pcVar1)(tcg_ctx,retv,tcg_ctx->cpu_env,addr,cmpv,newv,pTVar2);
    tcg_temp_free_i32(tcg_ctx,pTVar2);
    if ((opc & MO_ASHIFT) != MO_8) {
      tcg_gen_ext_i32(tcg_ctx,retv,retv,opc);
    }
  }
  return;
}

Assistant:

void tcg_gen_atomic_cmpxchg_i32(TCGContext *tcg_ctx, TCGv_i32 retv, TCGv addr, TCGv_i32 cmpv,
                                TCGv_i32 newv, TCGArg idx, MemOp memop)
{
    memop = tcg_canonicalize_memop(memop, 0, 0);

    if (!(tcg_ctx->tb_cflags & CF_PARALLEL)) {
        TCGv_i32 t1 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);

        tcg_gen_ext_i32(tcg_ctx, t2, cmpv, memop & MO_SIZE);

        tcg_gen_qemu_ld_i32(tcg_ctx, t1, addr, idx, memop & ~MO_SIGN);
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_EQ, t2, t1, t2, newv, t1);
        tcg_gen_qemu_st_i32(tcg_ctx, t2, addr, idx, memop);
        tcg_temp_free_i32(tcg_ctx, t2);

        if (memop & MO_SIGN) {
            tcg_gen_ext_i32(tcg_ctx, retv, t1, memop);
        } else {
            tcg_gen_mov_i32(tcg_ctx, retv, t1);
        }
        tcg_temp_free_i32(tcg_ctx, t1);
    } else {
        gen_atomic_cx_i32 gen;

        gen = table_cmpxchg[memop & (MO_SIZE | MO_BSWAP)];
        tcg_debug_assert(gen != NULL);

        {
            TCGv_i32 oi = tcg_const_i32(tcg_ctx, make_memop_idx(memop & ~MO_SIGN, idx));
            gen(tcg_ctx, retv, tcg_ctx->cpu_env, addr, cmpv, newv, oi);
            tcg_temp_free_i32(tcg_ctx, oi);
        }

        if (memop & MO_SIGN) {
            tcg_gen_ext_i32(tcg_ctx, retv, retv, memop);
        }
    }
}